

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# private.hpp
# Opt level: O1

void baryonyx::info<int,std::__cxx11::string>
               (context *ctx,char *fmt,int *arg1,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args)

{
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  args_00;
  text_style local_30;
  pointer local_18;
  size_type sStack_10;
  
  if (5 < (int)ctx->log_priority) {
    local_30.background_color.value.rgb_color = 0;
    local_30.background_color._0_4_ = *arg1;
    local_18 = (args->_M_dataplus)._M_p;
    sStack_10 = args->_M_string_length;
    args_00.field_1.args_ = in_R9.args_;
    args_00.desc_ = (unsigned_long_long)&local_30.background_color;
    local_30.foreground_color = (color_type)fmt;
    ::fmt::v7::vprint<char_const*,char>
              (_stdout,(FILE *)(context::message_style + 0x78),&local_30,(char **)0xd1,args_00);
  }
  return;
}

Assistant:

inline bool
is_loggable(context::message_type current_level, int level) noexcept
{
    return static_cast<int>(current_level) >= level;
}